

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  ushort uVar1;
  sbyte sVar2;
  U16 *symbolNext;
  uint uVar3;
  long lVar4;
  undefined4 uVar5;
  int iVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t pos;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  U32 s;
  ulong uVar14;
  ulong uVar15;
  U64 sv;
  long lVar16;
  U32 s_1;
  uint uVar17;
  long lVar18;
  
  uVar15 = (ulong)(maxSymbolValue + 1);
  uVar5 = 1;
  uVar8 = 1 << (tableLog & 0x1f);
  sVar2 = ((byte)tableLog < 0x21) * (' ' - (byte)tableLog);
  uVar13 = (uint)(-1 << sVar2) >> sVar2;
  uVar3 = uVar13;
  for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    sVar7 = normalizedCounter[uVar14];
    if (sVar7 == -1) {
      uVar11 = (ulong)uVar3;
      uVar3 = uVar3 - 1;
      dt[uVar11 + 1].baseValue = (U32)uVar14;
      sVar7 = 1;
    }
    else if ((0x10000 << (tableLog - 1 & 0x1f)) >> 0x10 <= (int)sVar7) {
      uVar5 = 0;
    }
    *(short *)((long)wksp + uVar14 * 2) = sVar7;
  }
  dt->nextState = (short)uVar5;
  dt->nbAdditionalBits = (char)((uint)uVar5 >> 0x10);
  dt->nbBits = (char)((uint)uVar5 >> 0x18);
  dt->baseValue = tableLog;
  iVar6 = (uVar8 >> 3) + (uVar8 >> 1) + 3;
  if (uVar3 == uVar13) {
    lVar4 = (long)wksp + 0x6a;
    lVar16 = 0;
    lVar12 = 0;
    for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      sVar7 = normalizedCounter[uVar14];
      *(long *)((long)wksp + lVar12 + 0x6a) = lVar16;
      for (lVar18 = 0x72; lVar18 + -0x6a < (long)sVar7; lVar18 = lVar18 + 8) {
        *(long *)((long)wksp + lVar18 + lVar12) = lVar16;
      }
      lVar12 = lVar12 + sVar7;
      lVar16 = lVar16 + 0x101010101010101;
    }
    uVar3 = 0;
    for (uVar15 = 0; uVar15 < uVar8; uVar15 = uVar15 + 2) {
      uVar10 = uVar3;
      for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
        dt[(ulong)(uVar10 & uVar13) + 1].baseValue = (uint)*(byte *)(lVar4 + lVar12);
        uVar10 = uVar10 + iVar6;
      }
      uVar3 = uVar3 + iVar6 * 2 & uVar13;
      lVar4 = lVar4 + 2;
    }
  }
  else {
    uVar11 = 0;
    for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      uVar9 = 0;
      uVar10 = (uint)(ushort)normalizedCounter[uVar14];
      if (normalizedCounter[uVar14] < 1) {
        uVar10 = uVar9;
      }
      for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
        dt[uVar11 + 1].baseValue = (U32)uVar14;
        do {
          uVar17 = (int)uVar11 + iVar6 & uVar13;
          uVar11 = (ulong)uVar17;
        } while (uVar3 < uVar17);
      }
    }
  }
  for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
    uVar14 = (ulong)dt[uVar15 + 1].baseValue;
    uVar1 = *(ushort *)((long)wksp + uVar14 * 2);
    *(ushort *)((long)wksp + uVar14 * 2) = uVar1 + 1;
    iVar6 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    dt[uVar15 + 1].nbBits = (BYTE)(tableLog - iVar6);
    dt[uVar15 + 1].nextState = (uVar1 << (tableLog - iVar6 & 0x1f)) - (short)uVar8;
    dt[uVar15 + 1].nbAdditionalBits = nbAdditionalBits[uVar14];
    dt[uVar15 + 1].baseValue = baseValue[uVar14];
  }
  return;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static void ZSTD_buildFSETable_body_bmi2(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}